

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cc
# Opt level: O3

void __thiscall draco::PointCloud::DeduplicatePointIds(PointCloud *this)

{
  pointer puVar1;
  __uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> _Var2;
  _Hash_node_base *p_Var3;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> IVar4;
  size_type sVar5;
  ulong uVar6;
  __node_base_ptr *pp_Var7;
  __node_ptr p_Var8;
  _Hash_node_base *p_Var9;
  __node_base_ptr *pp_Var10;
  uint uVar11;
  __hash_code __c;
  __node_base _Var12;
  ulong uVar13;
  ulong uVar14;
  size_type __n;
  uint uVar15;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> IVar16;
  pointer __ptr;
  _Hash_node_base *__c_00;
  undefined1 auVar17 [16];
  __buckets_alloc_type __alloc_1;
  unordered_map<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:212:24),_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
  unique_point_map;
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  unique_points;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>
  index_map;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> local_c8;
  new_allocator<std::__detail::_Hash_node_base_*> local_c1;
  _Hashtable<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>,_std::__detail::_Select1st,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:212:24),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_c0;
  void *local_78;
  iterator iStack_70;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> *local_68;
  PointCloud *local_58;
  ulong local_50;
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  local_48;
  
  local_c0._M_buckets = &local_c0._M_single_bucket;
  local_c0._M_bucket_count = 1;
  local_c0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_c0._M_element_count = 0;
  local_c0._M_rehash_policy._M_max_load_factor = 1.0;
  local_c0._M_rehash_policy._M_next_resize = 0;
  local_c0._M_single_bucket = (__node_base_ptr)0x0;
  local_c0.
  super__Hashtable_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::__detail::_Select1st,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:212:24),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  .
  super__Hash_code_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::__detail::_Select1st,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
  .
  super__Hashtable_ebo_helper<1,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_false>
  ._M_tp.this = (_Hashtable_ebo_helper<1,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_false>
                 )(_Hashtable_ebo_helper<1,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_false>
                   )this;
  local_c0.
  super__Hashtable_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::__detail::_Select1st,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:212:24),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  .
  super__Hashtable_ebo_helper<0,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:212:24),_false>
  ._M_tp.this = (key_equal)(key_equal)this;
  uVar6 = std::__detail::_Prime_rehash_policy::_M_next_bkt((ulong)&local_c0._M_rehash_policy);
  if (local_c0._M_bucket_count < uVar6) {
    if (uVar6 == 1) {
      local_c0._M_single_bucket = (__node_base_ptr)0x0;
      local_c0._M_buckets = &local_c0._M_single_bucket;
      local_c0._M_bucket_count = uVar6;
    }
    else {
      pp_Var7 = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                          ((new_allocator<std::__detail::_Hash_node_base_*> *)&local_48,uVar6,
                           (void *)0x0);
      memset(pp_Var7,0,uVar6 << 3);
      local_c0._M_buckets = pp_Var7;
      local_c0._M_bucket_count = uVar6;
    }
  }
  std::
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  ::vector(&local_48,(ulong)this->num_points_,(allocator_type *)&local_78);
  local_78 = (void *)0x0;
  iStack_70._M_current = (IndexType<unsigned_int,_draco::PointIndex_tag_type_> *)0x0;
  local_68 = (IndexType<unsigned_int,_draco::PointIndex_tag_type_> *)0x0;
  local_c8.value_ = 0;
  if (this->num_points_ != 0) {
    uVar6 = 0;
    local_58 = this;
    do {
      IVar4.value_ = local_c8.value_;
      puVar1 = (((vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                  *)((long)local_c0.
                           super__Hashtable_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::__detail::_Select1st,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:212:24),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           .
                           super__Hash_code_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::__detail::_Select1st,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                           .
                           super__Hashtable_ebo_helper<1,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_false>
                           ._M_tp.this + 0x10))->
               super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar14 = (ulong)local_c8.value_;
      uVar11 = (uint)((ulong)((long)*(pointer *)
                                     ((long)local_c0.
                                            super__Hashtable_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::__detail::_Select1st,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:212:24),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                            .
                                            super__Hash_code_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::__detail::_Select1st,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                                            .
                                            super__Hashtable_ebo_helper<1,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_false>
                                            ._M_tp.this + 0x18) - (long)puVar1) >> 3);
      if ((int)uVar11 < 1) {
        __c = 0;
      }
      else {
        uVar13 = 0;
        uVar15 = 0;
        do {
          _Var2._M_t.
          super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
          .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
               puVar1[uVar13]._M_t.
               super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
               ._M_t;
          IVar16.value_ = local_c8.value_;
          if (*(char *)((long)_Var2._M_t.
                              super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                              .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl +
                       100) == '\0') {
            IVar16.value_ =
                 *(uint *)(*(long *)((long)_Var2._M_t.
                                           super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                           .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                           _M_head_impl + 0x48) + uVar14 * 4);
          }
          uVar15 = uVar15 * 2 ^ IVar16.value_ << 2;
          uVar13 = uVar13 + 1;
        } while ((uVar11 & 0x7fffffff) != uVar13);
        __c = (__hash_code)uVar15;
      }
      p_Var8 = std::
               _Hashtable<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>,_std::__detail::_Select1st,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:212:24),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::_M_find_node(&local_c0,__c % local_c0._M_bucket_count,
                              (key_type *)(ulong)local_c8.value_,__c);
      if (p_Var8 == (__node_ptr)0x0) {
        p_Var9 = (_Hash_node_base *)operator_new(0x18);
        sVar5 = local_c0._M_bucket_count;
        p_Var9->_M_nxt = (_Hash_node_base *)0x0;
        *(uint *)&p_Var9[1]._M_nxt = IVar4.value_;
        *(int *)((long)&p_Var9[1]._M_nxt + 4) = (int)uVar6;
        puVar1 = (((vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                    *)((long)local_c0.
                             super__Hashtable_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::__detail::_Select1st,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:212:24),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             .
                             super__Hash_code_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::__detail::_Select1st,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                             .
                             super__Hashtable_ebo_helper<1,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_false>
                             ._M_tp.this + 0x10))->
                 super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar11 = (uint)((ulong)((long)*(pointer *)
                                       ((long)local_c0.
                                              super__Hashtable_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::__detail::_Select1st,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:212:24),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                              .
                                              super__Hash_code_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::__detail::_Select1st,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                                              .
                                              super__Hashtable_ebo_helper<1,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_false>
                                              ._M_tp.this + 0x18) - (long)puVar1) >> 3);
        if ((int)uVar11 < 1) {
          __c_00 = (_Hash_node_base *)0x0;
        }
        else {
          uVar13 = 0;
          uVar15 = 0;
          do {
            _Var2._M_t.
            super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
            .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
                 puVar1[uVar13]._M_t.
                 super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                 ._M_t;
            IVar16.value_ = IVar4.value_;
            if (*(char *)((long)_Var2._M_t.
                                super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl
                         + 100) == '\0') {
              IVar16.value_ =
                   *(uint *)(*(long *)((long)_Var2._M_t.
                                             super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                             .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                             _M_head_impl + 0x48) + uVar14 * 4);
            }
            uVar15 = uVar15 * 2 ^ IVar16.value_ << 2;
            uVar13 = uVar13 + 1;
          } while ((uVar11 & 0x7fffffff) != uVar13);
          __c_00 = (_Hash_node_base *)(ulong)uVar15;
        }
        uVar14 = (ulong)__c_00 % local_c0._M_bucket_count;
        local_50 = uVar6;
        p_Var8 = std::
                 _Hashtable<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>,_std::__detail::_Select1st,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:212:24),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::_M_find_node(&local_c0,uVar14,(key_type *)(ulong)IVar4.value_,(__hash_code)__c_00
                               );
        if (p_Var8 == (__node_ptr)0x0) {
          auVar17 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                              ((ulong)&local_c0._M_rehash_policy,sVar5,local_c0._M_element_count);
          __n = auVar17._8_8_;
          if ((auVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            if (__n == 1) {
              local_c0._M_single_bucket = (__node_base_ptr)0x0;
              pp_Var7 = &local_c0._M_single_bucket;
            }
            else {
              pp_Var7 = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                                  (&local_c1,__n,(void *)0x0);
              memset(pp_Var7,0,__n * 8);
            }
            _Var12._M_nxt = local_c0._M_before_begin._M_nxt;
            local_c0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            if (_Var12._M_nxt != (_Hash_node_base *)0x0) {
              uVar6 = 0;
              do {
                p_Var3 = (_Var12._M_nxt)->_M_nxt;
                uVar14 = (ulong)_Var12._M_nxt[2]._M_nxt % __n;
                if (pp_Var7[uVar14] == (_Hash_node_base *)0x0) {
                  (_Var12._M_nxt)->_M_nxt = local_c0._M_before_begin._M_nxt;
                  pp_Var7[uVar14] = &local_c0._M_before_begin;
                  local_c0._M_before_begin._M_nxt = _Var12._M_nxt;
                  if ((_Var12._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
                    pp_Var10 = pp_Var7 + uVar6;
                    goto LAB_0014cecb;
                  }
                }
                else {
                  (_Var12._M_nxt)->_M_nxt = pp_Var7[uVar14]->_M_nxt;
                  pp_Var10 = &pp_Var7[uVar14]->_M_nxt;
                  uVar14 = uVar6;
LAB_0014cecb:
                  *pp_Var10 = _Var12._M_nxt;
                }
                _Var12._M_nxt = p_Var3;
                uVar6 = uVar14;
              } while (p_Var3 != (_Hash_node_base *)0x0);
            }
            if (&local_c0._M_single_bucket != local_c0._M_buckets) {
              operator_delete(local_c0._M_buckets,local_c0._M_bucket_count << 3);
            }
            uVar14 = (ulong)__c_00 % __n;
            local_c0._M_buckets = pp_Var7;
            local_c0._M_bucket_count = __n;
          }
          uVar6 = local_50;
          this = local_58;
          p_Var9[2]._M_nxt = __c_00;
          if (local_c0._M_buckets[uVar14] == (_Hash_node_base *)0x0) {
            p_Var9->_M_nxt = local_c0._M_before_begin._M_nxt;
            if (local_c0._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
              local_c0._M_buckets
              [(ulong)local_c0._M_before_begin._M_nxt[2]._M_nxt % local_c0._M_bucket_count] = p_Var9
              ;
            }
            local_c0._M_buckets[uVar14] = &local_c0._M_before_begin;
            local_c0._M_before_begin._M_nxt = p_Var9;
          }
          else {
            p_Var9->_M_nxt = local_c0._M_buckets[uVar14]->_M_nxt;
            local_c0._M_buckets[uVar14]->_M_nxt = p_Var9;
          }
          uVar11 = (uint)uVar6;
          local_c0._M_element_count = local_c0._M_element_count + 1;
        }
        else {
          operator_delete(p_Var9,0x18);
          uVar11 = (uint)local_50;
          this = local_58;
        }
        local_48.
        super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[local_c8.value_].value_ = uVar11;
        uVar6 = (ulong)(uVar11 + 1);
        if (iStack_70._M_current == local_68) {
          std::
          vector<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>>>
          ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>const&>
                    ((vector<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>>>
                      *)&local_78,iStack_70,&local_c8);
        }
        else {
          (iStack_70._M_current)->value_ = local_c8.value_;
          iStack_70._M_current = iStack_70._M_current + 1;
        }
      }
      else {
        local_48.
        super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar14].value_ =
             *(uint *)((long)&(p_Var8->
                              super__Hash_node_value<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_true>
                              ).
                              super__Hash_node_value_base<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                              ._M_storage._M_storage + 4);
      }
      local_c8.value_ = local_c8.value_ + 1;
    } while (local_c8.value_ < this->num_points_);
    if ((uint)uVar6 != this->num_points_) {
      (*this->_vptr_PointCloud[6])(this,&local_48,&local_78);
      this->num_points_ = (uint)uVar6;
    }
  }
  if (local_78 != (void *)0x0) {
    operator_delete(local_78,(long)local_68 - (long)local_78);
  }
  if (local_48.
      super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>,_std::__detail::_Select1st,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:212:24),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_c0);
  return;
}

Assistant:

void PointCloud::DeduplicatePointIds() {
  // Hashing function for a single vertex.
  auto point_hash = [this](PointIndex p) {
    PointIndex::ValueType hash = 0;
    for (int32_t i = 0; i < this->num_attributes(); ++i) {
      const AttributeValueIndex att_id = attribute(i)->mapped_index(p);
      hash = static_cast<uint32_t>(HashCombine(att_id.value(), hash));
    }
    return hash;
  };
  // Comparison function between two vertices.
  auto point_compare = [this](PointIndex p0, PointIndex p1) {
    for (int32_t i = 0; i < this->num_attributes(); ++i) {
      const AttributeValueIndex att_id0 = attribute(i)->mapped_index(p0);
      const AttributeValueIndex att_id1 = attribute(i)->mapped_index(p1);
      if (att_id0 != att_id1) {
        return false;
      }
    }
    return true;
  };

  std::unordered_map<PointIndex, PointIndex, decltype(point_hash),
                     decltype(point_compare)>
      unique_point_map(num_points_, point_hash, point_compare);
  int32_t num_unique_points = 0;
  IndexTypeVector<PointIndex, PointIndex> index_map(num_points_);
  std::vector<PointIndex> unique_points;
  // Go through all vertices and find their duplicates.
  for (PointIndex i(0); i < num_points_; ++i) {
    const auto it = unique_point_map.find(i);
    if (it != unique_point_map.end()) {
      index_map[i] = it->second;
    } else {
      unique_point_map.insert(std::make_pair(i, PointIndex(num_unique_points)));
      index_map[i] = num_unique_points++;
      unique_points.push_back(i);
    }
  }
  if (num_unique_points == num_points_) {
    return;  // All vertices are already unique.
  }

  ApplyPointIdDeduplication(index_map, unique_points);
  set_num_points(num_unique_points);
}